

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O3

void tcu::opt::registerLegacyOptions(Parser *parser)

{
  OptInfo local_70;
  
  local_70.setDefault = (SetDefaultFunc)0x0;
  local_70.shortName = (char *)0x0;
  local_70.longName = "deqp-egl-config-id";
  local_70.description = "Legacy name for --deqp-gl-config-id";
  local_70.defaultValue = "-1";
  local_70.isFlag = false;
  local_70.parse = de::cmdline::parseType<int>;
  local_70.namedValues = (void *)0x0;
  local_70.namedValuesEnd = (void *)0x0;
  local_70.namedValueStride = 0x10;
  local_70.dispatchParse = de::cmdline::detail::Parser::dispatchParse<tcu::opt::GLConfigID>;
  de::cmdline::detail::Parser::addOption(parser,&local_70);
  local_70.setDefault = (SetDefaultFunc)0x0;
  local_70.shortName = (char *)0x0;
  local_70.longName = "deqp-egl-config-name";
  local_70.description = "Legacy name for --deqp-gl-config-name";
  local_70.defaultValue = (char *)0x0;
  local_70.isFlag = false;
  local_70.parse = de::cmdline::parseType<std::__cxx11::string>;
  local_70.namedValues = (void *)0x0;
  local_70.namedValuesEnd = (void *)0x0;
  local_70.namedValueStride = 0x28;
  local_70.dispatchParse = de::cmdline::detail::Parser::dispatchParse<tcu::opt::GLConfigName>;
  de::cmdline::detail::Parser::addOption(parser,&local_70);
  return;
}

Assistant:

void registerLegacyOptions (de::cmdline::Parser& parser)
{
	using de::cmdline::Option;

	parser
		<< Option<GLConfigID>			(DE_NULL,	"deqp-egl-config-id",			"Legacy name for --deqp-gl-config-id",	"-1")
		<< Option<GLConfigName>			(DE_NULL,	"deqp-egl-config-name",			"Legacy name for --deqp-gl-config-name");
}